

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O0

Result_type __thiscall
sig::
Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
::operator()(Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
             *this,int *args)

{
  bool bVar1;
  iterator iter;
  Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
  local_68;
  function<void_()> *local_60;
  Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
  local_58;
  Optional_last_value<void> local_4d [8];
  Optional_last_value<void> comb;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  Bound_slot_container slots;
  int *args_local;
  Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
  *this_local;
  
  bVar1 = Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
          ::enabled((Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
                     *)this);
  if (bVar1) {
    bind_args<int&>((Bound_slot_container *)&lock._M_owns,this,args);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,(mutex_type *)(this + 0xe0));
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
    local_60 = (function<void_()> *)
               std::begin<std::vector<std::function<void()>,std::allocator<std::function<void()>>>>
                         ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           *)&lock._M_owns);
    Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
    ::Slot_iterator(&local_58,
                    (__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                     )local_60);
    iter = std::end<std::vector<std::function<void()>,std::allocator<std::function<void()>>>>
                     ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                      &lock._M_owns);
    Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
    ::Slot_iterator(&local_68,
                    (__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                     )iter._M_current);
    Optional_last_value<void>::operator()(local_4d,local_58,local_68);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
               &lock._M_owns);
  }
  return;
}

Assistant:

Result_type operator()(Arguments&&... args) {
        if (!this->enabled()) {
            return Result_type();
        }
        auto slots = bind_args(std::forward<Arguments>(args)...);
        std::unique_lock<Mutex> lock{mtx_};
        auto comb = combiner_;
        lock.unlock();
        return comb(Bound_slot_iterator{std::begin(slots)},
                    Bound_slot_iterator{std::end(slots)});
    }